

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O2

void __thiscall
icu_63::SimpleTimeZone::SimpleTimeZone(SimpleTimeZone *this,int32_t rawOffsetGMT,UnicodeString *ID)

{
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,ID);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleTimeZone_003a1a70;
  this->startMonth = '\0';
  this->startDay = '\0';
  this->startDayOfWeek = '\0';
  this->endTime = 0;
  this->startYear = 0;
  this->startTime = 0;
  this->startTimeMode = WALL_TIME;
  *(undefined8 *)((long)&this->startTimeMode + 3) = 0;
  this->rawOffset = rawOffsetGMT;
  this->useDaylight = '\0';
  this->startMode = DOM_MODE;
  this->endMode = DOM_MODE;
  this->dstSavings = 3600000;
  this->transitionRulesInitialized = '\0';
  this->initialRule = (InitialTimeZoneRule *)0x0;
  this->firstTransition = (TimeZoneTransition *)0x0;
  this->stdRule = (AnnualTimeZoneRule *)0x0;
  this->dstRule = (AnnualTimeZoneRule *)0x0;
  return;
}

Assistant:

SimpleTimeZone::SimpleTimeZone(int32_t rawOffsetGMT, const UnicodeString& ID)
:   BasicTimeZone(ID),
    startMonth(0),
    startDay(0),
    startDayOfWeek(0),
    startTime(0),
    startTimeMode(WALL_TIME),
    endTimeMode(WALL_TIME),
    endMonth(0),
    endDay(0),
    endDayOfWeek(0),
    endTime(0),
    startYear(0),
    rawOffset(rawOffsetGMT),
    useDaylight(FALSE),
    startMode(DOM_MODE),
    endMode(DOM_MODE),
    dstSavings(U_MILLIS_PER_HOUR)
{
    clearTransitionRules();
}